

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugFrame.cpp
# Opt level: O3

void __thiscall llvm::DWARFDebugFrame::parse(DWARFDebugFrame *this,DWARFDataExtractor Data)

{
  char cVar1;
  ArchType AVar2;
  CIE *pCVar3;
  DWARFDataExtractor Data_00;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  FDE *pFVar9;
  value_type *pvVar10;
  size_t sVar11;
  uint64_t uVar12;
  uint32_t byte_size;
  ulong uVar13;
  Error *E;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 aVar17;
  char *pcVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  Optional<unsigned_long> OVar23;
  OptionalStorage<unsigned_long,_true> OVar24;
  uint64_t local_150;
  uint64_t CodeAlignmentFactor;
  int64_t DataAlignmentFactor;
  uint64_t ReturnAddressRegister;
  ulong local_130;
  ulong local_128;
  _func_int **local_120;
  uint64_t local_118;
  ulong local_110;
  void *pvStack_108;
  DenseMap<unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>
  CIEs;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_d0;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_c8;
  char local_c0;
  anon_union_4_2_fc7899a5_for_OptionalStorage<unsigned_int,_true>_2 local_bf;
  undefined3 uStack_bb;
  undefined1 local_b8 [8];
  StringRef AugmentationString;
  uint64_t local_98;
  uint64_t Length;
  pointer local_88;
  pointer local_80;
  uint local_78;
  undefined1 local_74 [4];
  uint32_t FDEPointerEncoding;
  uint32_t LSDAPointerEncoding;
  ArchType local_68;
  char local_64;
  Optional<unsigned_int> PersonalityEncoding;
  ulong local_58;
  uint64_t StartOffset;
  uint8_t local_42;
  uint8_t local_41;
  uint8_t SegmentDescriptorSize;
  ulong uStack_40;
  uint8_t AddressSize;
  uint64_t Offset;
  uint8_t Version;
  
  uStack_40 = 0;
  pvStack_108 = (void *)0x0;
  CIEs.Buckets = (DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*> *)0x0;
  CIEs.NumEntries = 0;
  if (Data.super_DataExtractor.Data.Length == 0) {
    uVar16 = 0;
  }
  else {
    local_120 = (_func_int **)&PTR__FrameEntry_01078480;
    uVar16 = 0;
    StartOffset = (uint64_t)this;
    do {
      local_58 = uVar16;
      uVar7 = DWARFDataExtractor::getRelocatedValue
                        (&Data,4,&stack0xffffffffffffffc0,(uint64_t *)0x0,(Error *)0x0);
      uVar8 = uVar7;
      if (uVar7 == 0xffffffff) {
        local_98 = uVar7;
        uVar8 = DWARFDataExtractor::getRelocatedValue
                          (&Data,8,&stack0xffffffffffffffc0,(uint64_t *)0x0,(Error *)0x0);
      }
      uVar16 = uStack_40;
      byte_size = ((byte)~*(byte *)(StartOffset + 4) & 1) * 4 + 4;
      if (uVar7 != 0xffffffff) {
        byte_size = 4;
      }
      local_98 = uVar8;
      pFVar9 = (FDE *)DataExtractor::getUnsigned
                                (&Data.super_DataExtractor,&stack0xffffffffffffffc0,byte_size,
                                 (Error *)0x0);
      uVar12 = StartOffset;
      if (((pFVar9 == (FDE *)0xffffffff) ||
          (pFVar9 == (FDE *)0xffffffffffffffff && uVar7 == 0xffffffff)) ||
         (pFVar9 == (FDE *)0x0 && *(char *)(StartOffset + 4) == '\x01')) {
        Offset._7_1_ = DataExtractor::getU8
                                 (&Data.super_DataExtractor,&stack0xffffffffffffffc0,(Error *)0x0);
        local_b8 = (undefined1  [8])
                   DataExtractor::getCStr(&Data.super_DataExtractor,&stack0xffffffffffffffc0);
        if (local_b8 == (undefined1  [8])0x0) {
          local_b8 = (undefined1  [8])0xe67796;
        }
        AugmentationString.Data = (char *)strlen((char *)local_b8);
        if (Offset._7_1_ < 4) {
          local_41 = Data.super_DataExtractor.AddressSize;
LAB_00d614f4:
          local_42 = '\0';
          Data.super_DataExtractor.AddressSize = local_41;
        }
        else {
          Data.super_DataExtractor.AddressSize =
               DataExtractor::getU8(&Data.super_DataExtractor,&stack0xffffffffffffffc0,(Error *)0x0)
          ;
          local_41 = Data.super_DataExtractor.AddressSize;
          if (Offset._7_1_ < 4) goto LAB_00d614f4;
          local_42 = DataExtractor::getU8
                               (&Data.super_DataExtractor,&stack0xffffffffffffffc0,(Error *)0x0);
        }
        local_150 = DataExtractor::getULEB128
                              (&Data.super_DataExtractor,&stack0xffffffffffffffc0,(Error *)0x0);
        CodeAlignmentFactor =
             DataExtractor::getSLEB128(&Data.super_DataExtractor,&stack0xffffffffffffffc0);
        uVar15 = _FDEPointerEncoding;
        if (Offset._7_1_ == 1) {
          bVar6 = DataExtractor::getU8
                            (&Data.super_DataExtractor,&stack0xffffffffffffffc0,(Error *)0x0);
          DataAlignmentFactor = (int64_t)bVar6;
        }
        else {
          DataAlignmentFactor =
               DataExtractor::getULEB128
                         (&Data.super_DataExtractor,&stack0xffffffffffffffc0,(Error *)0x0);
        }
        Length = (long)"\n\r\t" + 3;
        local_88 = (pointer)0x0;
        local_78 = 0;
        local_74 = (undefined1  [4])0xff;
        local_c8.value = local_c8.value & 0xffffffffffffff00;
        local_c0 = '\0';
        local_68 = local_68 & 0xffffff00;
        local_64 = '\0';
        if ((*(char *)(uVar12 + 4) == '\x01') &&
           (iVar14 = (int)AugmentationString.Data, uVar15 = _FDEPointerEncoding, iVar14 != 0)) {
          pcVar18 = (char *)0x0;
          bVar5 = false;
          bVar4 = false;
          do {
            if (AugmentationString.Data <= pcVar18) {
              __assert_fail("Index < Length && \"Invalid index!\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/StringRef.h"
                            ,0xf9,"char llvm::StringRef::operator[](size_t) const");
            }
            cVar1 = *(char *)((long)local_b8 + (long)pcVar18);
            switch(cVar1) {
            case 'L':
              bVar6 = DataExtractor::getU8
                                (&Data.super_DataExtractor,&stack0xffffffffffffffc0,(Error *)0x0);
              local_74 = (undefined1  [4])(uint)bVar6;
              break;
            case 'M':
            case 'N':
            case 'O':
            case 'Q':
switchD_00d616dc_caseD_4d:
              pcVar18 = "Unknown augmentation character in entry at %lx";
LAB_00d61b0f:
              ReportError(local_58,pcVar18);
            case 'P':
              if (local_c0 != '\0') {
                pcVar18 = "Duplicate personality in entry at %lx";
                goto LAB_00d61b0f;
              }
              bVar6 = DataExtractor::getU8
                                (&Data.super_DataExtractor,&stack0xffffffffffffffc0,(Error *)0x0);
              local_68 = (ArchType)bVar6;
              if (local_64 == '\0') {
                local_64 = '\x01';
              }
              else if (local_64 == '\0') {
                __assert_fail("hasVal",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/Optional.h"
                              ,0xad,
                              "T &llvm::optional_detail::OptionalStorage<unsigned int>::getValue() & [T = unsigned int]"
                             );
              }
              uVar7 = uStack_40 + *(long *)(StartOffset + 8);
              if (*(long *)(StartOffset + 8) == 0) {
                uVar7 = 0;
              }
              OVar23 = DWARFDataExtractor::getEncodedPointer
                                 (&Data,&stack0xffffffffffffffc0,bVar6,uVar7);
              local_c8 = OVar23.Storage.field_0;
              local_c0 = OVar23.Storage.hasVal;
              uStack_bb = PersonalityEncoding.Storage._4_3_;
              local_bf = PersonalityEncoding.Storage.field_0;
              break;
            case 'R':
              bVar6 = DataExtractor::getU8
                                (&Data.super_DataExtractor,&stack0xffffffffffffffc0,(Error *)0x0);
              local_78 = (uint)bVar6;
              break;
            case 'S':
              break;
            default:
              if (cVar1 != 'B') {
                if (cVar1 != 'z') goto switchD_00d616dc_caseD_4d;
                if ((int)pcVar18 != 0) {
                  pcVar18 = "\'z\' must be the first character at %lx";
                  goto LAB_00d61b0f;
                }
                uVar7 = DataExtractor::getULEB128
                                  (&Data.super_DataExtractor,&stack0xffffffffffffffc0,(Error *)0x0);
                bVar4 = bVar5;
                if (!bVar5) {
                  bVar4 = true;
                }
                local_130 = uStack_40;
                _FDEPointerEncoding = uVar7 + uStack_40;
                bVar5 = bVar4;
              }
            }
            pcVar18 = pcVar18 + 1;
          } while (iVar14 != (int)pcVar18);
          uVar15 = _FDEPointerEncoding;
          uVar12 = StartOffset;
          if (bVar4) {
            if (uStack_40 != _FDEPointerEncoding) {
              ReportError(local_58,"Parsing augmentation data at %lx failed");
            }
            sVar11 = local_130;
            if (Data.super_DataExtractor.Data.Length < local_130) {
              sVar11 = Data.super_DataExtractor.Data.Length;
            }
            uVar13 = _FDEPointerEncoding;
            if (_FDEPointerEncoding < sVar11) {
              uVar13 = sVar11;
            }
            if (Data.super_DataExtractor.Data.Length < _FDEPointerEncoding) {
              uVar13 = Data.super_DataExtractor.Data.Length;
            }
            local_88 = (pointer)(uVar13 - sVar11);
            Length = (uint64_t)(Data.super_DataExtractor.Data.Data + sVar11);
          }
        }
        _FDEPointerEncoding = uVar15;
        std::
        make_unique<llvm::dwarf::CIE,unsigned_long&,unsigned_long&,unsigned_char&,llvm::StringRef&,unsigned_char&,unsigned_char&,unsigned_long&,long&,unsigned_long&,llvm::StringRef&,unsigned_int&,unsigned_int&,llvm::Optional<unsigned_long>&,llvm::Optional<unsigned_int>&,llvm::Triple::ArchType_const&>
                  ((unsigned_long *)&PersonalityEncoding,&local_58,(uchar *)&local_98,
                   (StringRef *)((long)&Offset + 7),local_b8,&local_41,(unsigned_long *)&local_42,
                   (long *)&local_150,&CodeAlignmentFactor,(StringRef *)&DataAlignmentFactor,
                   (uint *)&Length,&local_78,(Optional<unsigned_long> *)local_74,
                   (Optional<unsigned_int> *)&local_c8,&local_68);
        pCVar3 = (CIE *)CONCAT44(PersonalityEncoding.Storage._4_4_,
                                 PersonalityEncoding.Storage.field_0.value);
        pvVar10 = DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>,_unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>
                  ::FindAndConstruct((DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>,_unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>
                                      *)&pvStack_108,&local_58);
        (pvVar10->super_pair<unsigned_long,_llvm::dwarf::CIE_*>).second = pCVar3;
        std::
        vector<std::unique_ptr<llvm::dwarf::FrameEntry,std::default_delete<llvm::dwarf::FrameEntry>>,std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,std::default_delete<llvm::dwarf::FrameEntry>>>>
        ::emplace_back<std::unique_ptr<llvm::dwarf::CIE,std::default_delete<llvm::dwarf::CIE>>>
                  ((vector<std::unique_ptr<llvm::dwarf::FrameEntry,std::default_delete<llvm::dwarf::FrameEntry>>,std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,std::default_delete<llvm::dwarf::FrameEntry>>>>
                    *)&this->Entries,
                   (unique_ptr<llvm::dwarf::CIE,_std::default_delete<llvm::dwarf::CIE>_> *)
                   &PersonalityEncoding);
        if ((long *)CONCAT44(PersonalityEncoding.Storage._4_4_,
                             PersonalityEncoding.Storage.field_0.value) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(PersonalityEncoding.Storage._4_4_,
                                         PersonalityEncoding.Storage.field_0.value) + 8))();
        }
      }
      else {
        local_b8 = (undefined1  [8])(uVar16 - (long)pFVar9);
        if (*(char *)(StartOffset + 4) == '\0') {
          local_b8 = (undefined1  [8])pFVar9;
        }
        pvVar10 = DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>,_unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>
                  ::FindAndConstruct((DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>,_unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>
                                      *)&pvStack_108,(unsigned_long *)local_b8);
        pCVar3 = (pvVar10->super_pair<unsigned_long,_llvm::dwarf::CIE_*>).second;
        if (*(char *)(uVar12 + 4) == '\x01') {
          if (pCVar3 == (CIE *)0x0) {
            ReportError(local_58,"Parsing FDE data at %lx failed due to missing CIE");
          }
          uVar7 = uStack_40 + *(long *)(uVar12 + 8);
          if (*(long *)(uVar12 + 8) == 0) {
            uVar7 = 0;
          }
          OVar23 = DWARFDataExtractor::getEncodedPointer
                             (&Data,&stack0xffffffffffffffc0,(uint8_t)pCVar3->FDEPointerEncoding,
                              uVar7);
          aVar17 = OVar23.Storage.field_0;
          if (((undefined1  [16])OVar23.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            aVar17.value = 0;
          }
          OVar23 = DWARFDataExtractor::getEncodedPointer
                             (&Data,&stack0xffffffffffffffc0,(uint8_t)pCVar3->FDEPointerEncoding,0);
          local_d0.value = OVar23.Storage.field_0.value;
          if (((undefined1  [16])OVar23.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            local_d0.value = 0;
          }
          if ((pCVar3->Augmentation).super_SmallVector<char,_8U>.super_SmallVectorImpl<char>.
              super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
              super_SmallVectorBase.Size == 0) goto LAB_00d6191e;
          uVar7 = DataExtractor::getULEB128
                            (&Data.super_DataExtractor,&stack0xffffffffffffffc0,(Error *)0x0);
          if (pCVar3->LSDAPointerEncoding == 0xff) {
            OVar24 = (OptionalStorage<unsigned_long,_true>)ZEXT816(0);
            uVar15 = uStack_40;
          }
          else {
            local_110 = uStack_40;
            uVar12 = *(long *)(StartOffset + 8) + uStack_40;
            if (*(long *)(StartOffset + 8) == 0) {
              uVar12 = 0;
            }
            local_118 = uVar7;
            OVar24 = (OptionalStorage<unsigned_long,_true>)
                     DWARFDataExtractor::getEncodedPointer
                               (&Data,&stack0xffffffffffffffc0,(uint8_t)pCVar3->LSDAPointerEncoding,
                                uVar12);
            local_128 = OVar24.field_0.value >> 8;
            uVar7 = local_118;
            uVar15 = local_110;
          }
          local_80 = OVar24._8_8_;
          if (uStack_40 != uVar15 + uVar7) {
            ReportError(local_58,"Parsing augmentation data at %lx failed");
          }
        }
        else {
          aVar17.value = DWARFDataExtractor::getRelocatedValue
                                   (&Data,(uint)Data.super_DataExtractor.AddressSize,
                                    &stack0xffffffffffffffc0,(uint64_t *)0x0,(Error *)0x0);
          local_d0.value =
               DWARFDataExtractor::getRelocatedValue
                         (&Data,(uint)Data.super_DataExtractor.AddressSize,&stack0xffffffffffffffc0,
                          (uint64_t *)0x0,(Error *)0x0);
LAB_00d6191e:
          OVar24 = (OptionalStorage<unsigned_long,_true>)ZEXT816(0);
        }
        local_80 = OVar24._8_8_;
        local_b8 = (undefined1  [8])operator_new(0x80);
        if (pCVar3 == (CIE *)0x0) {
          uVar19 = 0;
          uVar20 = 0;
          uVar21 = 0;
          uVar22 = 0;
        }
        else {
          uVar19 = (undefined4)pCVar3->CodeAlignmentFactor;
          uVar20 = *(undefined4 *)((long)&pCVar3->CodeAlignmentFactor + 4);
          uVar21 = (undefined4)pCVar3->DataAlignmentFactor;
          uVar22 = *(undefined4 *)((long)&pCVar3->DataAlignmentFactor + 4);
        }
        AVar2 = *(ArchType *)StartOffset;
        (((FDE *)local_b8)->super_FrameEntry).Kind = FK_FDE;
        (((FDE *)local_b8)->super_FrameEntry).Offset = local_58;
        (((FDE *)local_b8)->super_FrameEntry).Length = local_98;
        (((FDE *)local_b8)->super_FrameEntry).CFIs.Instructions.
        super__Vector_base<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (((FDE *)local_b8)->super_FrameEntry).CFIs.Instructions.
        super__Vector_base<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (((FDE *)local_b8)->super_FrameEntry).CFIs.Instructions.
        super__Vector_base<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        *(undefined4 *)&(((FDE *)local_b8)->super_FrameEntry).CFIs.CodeAlignmentFactor = uVar19;
        *(undefined4 *)((long)&(((FDE *)local_b8)->super_FrameEntry).CFIs.CodeAlignmentFactor + 4) =
             uVar20;
        *(undefined4 *)&(((FDE *)local_b8)->super_FrameEntry).CFIs.DataAlignmentFactor = uVar21;
        *(undefined4 *)((long)&(((FDE *)local_b8)->super_FrameEntry).CFIs.DataAlignmentFactor + 4) =
             uVar22;
        (((FDE *)local_b8)->super_FrameEntry).CFIs.Arch = AVar2;
        (((FDE *)local_b8)->super_FrameEntry)._vptr_FrameEntry = local_120;
        ((FDE *)local_b8)->LinkedCIEOffset = (uint64_t)pFVar9;
        ((FDE *)local_b8)->InitialLocation = (uint64_t)aVar17;
        ((FDE *)local_b8)->AddressRange = (uint64_t)local_d0;
        ((FDE *)local_b8)->LinkedCIE = pCVar3;
        (((FDE *)local_b8)->LSDAAddress).Storage.field_0.value =
             OVar24.field_0.value & 0xff | local_128 << 8;
        (((FDE *)local_b8)->LSDAAddress).Storage.hasVal = SUB81(local_80,0);
        std::
        vector<std::unique_ptr<llvm::dwarf::FrameEntry,std::default_delete<llvm::dwarf::FrameEntry>>,std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,std::default_delete<llvm::dwarf::FrameEntry>>>>
        ::emplace_back<llvm::dwarf::FDE*>
                  ((vector<std::unique_ptr<llvm::dwarf::FrameEntry,std::default_delete<llvm::dwarf::FrameEntry>>,std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,std::default_delete<llvm::dwarf::FrameEntry>>>>
                    *)&this->Entries,(FDE **)local_b8);
        uVar12 = StartOffset;
      }
      uVar16 = uVar8 + uVar16;
      Data_00.super_DataExtractor.AddressSize = Data.super_DataExtractor.AddressSize;
      Data_00.super_DataExtractor.IsLittleEndian = Data.super_DataExtractor.IsLittleEndian;
      Data_00.super_DataExtractor._18_6_ = Data.super_DataExtractor._18_6_;
      Data_00.super_DataExtractor.Data.Length = Data.super_DataExtractor.Data.Length;
      Data_00.super_DataExtractor.Data.Data = Data.super_DataExtractor.Data.Data;
      Data_00.Obj = Data.Obj;
      Data_00.Section = Data.Section;
      dwarf::CFIProgram::parse
                ((CFIProgram *)&Length,Data_00,
                 (uint64_t *)(*(long *)(*(long *)(uVar12 + 0x18) + -8) + 0x20),
                 (uint64_t)&stack0xffffffffffffffc0);
      if (1 < Length) {
        ReturnAddressRegister = Length | 1;
        Length = 0;
        toString_abi_cxx11_((string *)local_b8,(llvm *)&ReturnAddressRegister,E);
        report_fatal_error((string *)local_b8,true);
      }
      if (uStack_40 != uVar16) {
        ReportError(local_58,"Parsing entry instructions at %lx failed");
      }
    } while (uVar16 < Data.super_DataExtractor.Data.Length);
    uVar16 = (ulong)CIEs.NumEntries << 4;
  }
  operator_delete(pvStack_108,uVar16,8);
  return;
}

Assistant:

void DWARFDebugFrame::parse(DWARFDataExtractor Data) {
  uint64_t Offset = 0;
  DenseMap<uint64_t, CIE *> CIEs;

  while (Data.isValidOffset(Offset)) {
    uint64_t StartOffset = Offset;

    bool IsDWARF64 = false;
    uint64_t Length = Data.getRelocatedValue(4, &Offset);
    uint64_t Id;

    if (Length == dwarf::DW_LENGTH_DWARF64) {
      // DWARF-64 is distinguished by the first 32 bits of the initial length
      // field being 0xffffffff. Then, the next 64 bits are the actual entry
      // length.
      IsDWARF64 = true;
      Length = Data.getRelocatedValue(8, &Offset);
    }

    // At this point, Offset points to the next field after Length.
    // Length is the structure size excluding itself. Compute an offset one
    // past the end of the structure (needed to know how many instructions to
    // read).
    uint64_t StartStructureOffset = Offset;
    uint64_t EndStructureOffset = Offset + Length;

    // The Id field's size depends on the DWARF format
    Id = Data.getUnsigned(&Offset, (IsDWARF64 && !IsEH) ? 8 : 4);
    bool IsCIE =
        ((IsDWARF64 && Id == DW64_CIE_ID) || Id == DW_CIE_ID || (IsEH && !Id));

    if (IsCIE) {
      uint8_t Version = Data.getU8(&Offset);
      const char *Augmentation = Data.getCStr(&Offset);
      StringRef AugmentationString(Augmentation ? Augmentation : "");
      uint8_t AddressSize = Version < 4 ? Data.getAddressSize() :
                                          Data.getU8(&Offset);
      Data.setAddressSize(AddressSize);
      uint8_t SegmentDescriptorSize = Version < 4 ? 0 : Data.getU8(&Offset);
      uint64_t CodeAlignmentFactor = Data.getULEB128(&Offset);
      int64_t DataAlignmentFactor = Data.getSLEB128(&Offset);
      uint64_t ReturnAddressRegister =
          Version == 1 ? Data.getU8(&Offset) : Data.getULEB128(&Offset);

      // Parse the augmentation data for EH CIEs
      StringRef AugmentationData("");
      uint32_t FDEPointerEncoding = DW_EH_PE_absptr;
      uint32_t LSDAPointerEncoding = DW_EH_PE_omit;
      Optional<uint64_t> Personality;
      Optional<uint32_t> PersonalityEncoding;
      if (IsEH) {
        Optional<uint64_t> AugmentationLength;
        uint64_t StartAugmentationOffset;
        uint64_t EndAugmentationOffset;

        // Walk the augmentation string to get all the augmentation data.
        for (unsigned i = 0, e = AugmentationString.size(); i != e; ++i) {
          switch (AugmentationString[i]) {
            default:
              ReportError(
                  StartOffset,
                  "Unknown augmentation character in entry at %" PRIx64);
            case 'L':
              LSDAPointerEncoding = Data.getU8(&Offset);
              break;
            case 'P': {
              if (Personality)
                ReportError(StartOffset,
                            "Duplicate personality in entry at %" PRIx64);
              PersonalityEncoding = Data.getU8(&Offset);
              Personality = Data.getEncodedPointer(
                  &Offset, *PersonalityEncoding,
                  EHFrameAddress ? EHFrameAddress + Offset : 0);
              break;
            }
            case 'R':
              FDEPointerEncoding = Data.getU8(&Offset);
              break;
            case 'S':
              // Current frame is a signal trampoline.
              break;
            case 'z':
              if (i)
                ReportError(StartOffset,
                            "'z' must be the first character at %" PRIx64);
              // Parse the augmentation length first.  We only parse it if
              // the string contains a 'z'.
              AugmentationLength = Data.getULEB128(&Offset);
              StartAugmentationOffset = Offset;
              EndAugmentationOffset = Offset + *AugmentationLength;
              break;
            case 'B':
              // B-Key is used for signing functions associated with this
              // augmentation string
              break;
          }
        }

        if (AugmentationLength.hasValue()) {
          if (Offset != EndAugmentationOffset)
            ReportError(StartOffset,
                        "Parsing augmentation data at %" PRIx64 " failed");

          AugmentationData = Data.getData().slice(StartAugmentationOffset,
                                                  EndAugmentationOffset);
        }
      }

      auto Cie = std::make_unique<CIE>(
          StartOffset, Length, Version, AugmentationString, AddressSize,
          SegmentDescriptorSize, CodeAlignmentFactor, DataAlignmentFactor,
          ReturnAddressRegister, AugmentationData, FDEPointerEncoding,
          LSDAPointerEncoding, Personality, PersonalityEncoding, Arch);
      CIEs[StartOffset] = Cie.get();
      Entries.emplace_back(std::move(Cie));
    } else {
      // FDE
      uint64_t CIEPointer = Id;
      uint64_t InitialLocation = 0;
      uint64_t AddressRange = 0;
      Optional<uint64_t> LSDAAddress;
      CIE *Cie = CIEs[IsEH ? (StartStructureOffset - CIEPointer) : CIEPointer];

      if (IsEH) {
        // The address size is encoded in the CIE we reference.
        if (!Cie)
          ReportError(StartOffset, "Parsing FDE data at %" PRIx64
                                   " failed due to missing CIE");

        if (auto Val = Data.getEncodedPointer(
                &Offset, Cie->getFDEPointerEncoding(),
                EHFrameAddress ? EHFrameAddress + Offset : 0)) {
          InitialLocation = *Val;
        }
        if (auto Val = Data.getEncodedPointer(
                &Offset, Cie->getFDEPointerEncoding(), 0)) {
          AddressRange = *Val;
        }

        StringRef AugmentationString = Cie->getAugmentationString();
        if (!AugmentationString.empty()) {
          // Parse the augmentation length and data for this FDE.
          uint64_t AugmentationLength = Data.getULEB128(&Offset);

          uint64_t EndAugmentationOffset = Offset + AugmentationLength;

          // Decode the LSDA if the CIE augmentation string said we should.
          if (Cie->getLSDAPointerEncoding() != DW_EH_PE_omit) {
            LSDAAddress = Data.getEncodedPointer(
                &Offset, Cie->getLSDAPointerEncoding(),
                EHFrameAddress ? Offset + EHFrameAddress : 0);
          }

          if (Offset != EndAugmentationOffset)
            ReportError(StartOffset,
                        "Parsing augmentation data at %" PRIx64 " failed");
        }
      } else {
        InitialLocation = Data.getRelocatedAddress(&Offset);
        AddressRange = Data.getRelocatedAddress(&Offset);
      }

      Entries.emplace_back(new FDE(StartOffset, Length, CIEPointer,
                                   InitialLocation, AddressRange,
                                   Cie, LSDAAddress, Arch));
    }

    if (Error E =
            Entries.back()->cfis().parse(Data, &Offset, EndStructureOffset)) {
      report_fatal_error(toString(std::move(E)));
    }

    if (Offset != EndStructureOffset)
      ReportError(StartOffset,
                  "Parsing entry instructions at %" PRIx64 " failed");
  }
}